

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

int __thiscall NavierStokesBase::steadyState(NavierStokesBase *this)

{
  ostringstream *this_00;
  double dVar1;
  pointer pSVar2;
  _Head_base<0UL,_amrex::MultiFab_*,_false> fabarray_;
  char cVar3;
  _Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> _Var4;
  pointer pGVar5;
  int *piVar6;
  double *pdVar7;
  double *pdVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  int *piVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  bool bVar17;
  double dVar18;
  gpu_tuple_element<0UL,_double> gVar19;
  Real RVar20;
  double dVar21;
  double dVar22;
  ReduceOps<amrex::ReduceOpMax> reduce_op;
  ReduceData<double> reduce_data;
  MFIter mfi;
  ReduceOps<amrex::ReduceOpMax> local_2d9;
  gpu_tuple_element<0UL,_double> local_2d8;
  Real local_2d0;
  uint local_2c4;
  int local_2c0;
  int local_2bc;
  ulong local_2b8;
  ulong local_2b0;
  int local_2a4;
  long local_2a0;
  double local_298;
  double dStack_290;
  NavierStokesBase *local_280;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_278;
  _Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  long local_240;
  long local_238;
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  Box local_20c;
  ReduceData<double> local_1f0;
  undefined1 local_1b8 [392];
  
  pSVar2 = (this->super_AmrLevel).state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  fabarray_._M_head_impl =
       *(MultiFab **)
        &(pSVar2->old_data)._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  if ((tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)fabarray_._M_head_impl ==
      (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
    uVar10 = 0;
  }
  else {
    local_278._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (pSVar2->new_data)._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
    local_280 = this;
    amrex::ReduceData<double>::ReduceData<amrex::ReduceOpMax>(&local_1f0,&local_2d9);
    amrex::MFIter::MFIter((MFIter *)local_1b8,(FabArrayBase *)fabarray_._M_head_impl,true);
    local_2d8.m_value = 0.0;
    if ((int)local_1b8._32_4_ < (int)local_1b8._40_4_) {
      local_2d8.m_value = 0.0;
      local_270.super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           (_Head_base<0UL,_amrex::MultiFab_*,_false>)
           (_Head_base<0UL,_amrex::MultiFab_*,_false>)fabarray_._M_head_impl;
      do {
        _Var4.super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
             local_270.super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
        piVar13 = (int *)(local_1b8 + 0x20);
        amrex::MFIter::tilebox(&local_20c,(MFIter *)local_1b8);
        pGVar5 = local_1f0.m_tuple.
                 super_vector<amrex::GpuTuple<double>,_std::allocator<amrex::GpuTuple<double>_>_>.
                 super__Vector_base<amrex::GpuTuple<double>,_std::allocator<amrex::GpuTuple<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar6 = piVar13;
        if ((Vector<int,_std::allocator<int>_> *)local_1b8._64_8_ !=
            (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar6 = (((vector<int,_std::allocator<int>_> *)local_1b8._64_8_)->
                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                   _M_start + (int)local_1b8._32_4_;
        }
        lVar12 = *(long *)(*(long *)((long)_Var4.super__Head_base<0UL,_amrex::MultiFab_*,_false>.
                                           _M_head_impl + 0x108) + (long)*piVar6 * 8);
        local_2a0 = *(long *)(lVar12 + 0x10);
        if ((Vector<int,_std::allocator<int>_> *)local_1b8._64_8_ !=
            (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar13 = (((vector<int,_std::allocator<int>_> *)local_1b8._64_8_)->
                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                    _M_start + (int)local_1b8._32_4_;
        }
        local_2b8 = (ulong)(uint)local_20c.smallend.vect[2];
        local_2a4 = local_20c.bigend.vect[2];
        if (local_20c.smallend.vect[2] <= local_20c.bigend.vect[2]) {
          local_228 = (long)((*(int *)(lVar12 + 0x24) - *(int *)(lVar12 + 0x18)) + 1);
          lVar14 = *(long *)(*(long *)&(((vector<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                                          *)((long)local_278._M_t.
                                                                                                      
                                                  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                                                  .super__Head_base<0UL,_amrex::MultiFab_*,_false>.
                                                  _M_head_impl + 0x108))->
                                       super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                                       )._M_impl + (long)*piVar13 * 8);
          local_238 = (long)((*(int *)(lVar14 + 0x24) - *(int *)(lVar14 + 0x18)) + 1);
          local_2bc = local_20c.smallend.vect[0];
          local_2c4 = local_20c.smallend.vect[1];
          local_230 = *(long *)(lVar14 + 0x10) + (long)*(int *)(lVar14 + 0x18) * -8;
          local_2d0 = (Real)CONCAT44(local_2d0._4_4_,local_20c.bigend.vect[0]);
          local_2a0 = local_2a0 + (long)*(int *)(lVar12 + 0x18) * -8;
          local_2c0 = local_20c.bigend.vect[1];
          local_258 = (long)*(int *)(lVar14 + 0x1c) * -8;
          local_268 = (long)((*(int *)(lVar14 + 0x28) - *(int *)(lVar14 + 0x1c)) + 1) * 8;
          local_260 = -(long)*(int *)(lVar14 + 0x20);
          lVar14 = ((*(int *)(lVar14 + 0x2c) - *(int *)(lVar14 + 0x20)) + 1) * local_238 * local_268
          ;
          local_240 = (long)*(int *)(lVar12 + 0x1c) * -8;
          local_250 = (long)((*(int *)(lVar12 + 0x28) - *(int *)(lVar12 + 0x1c)) + 1) * 8;
          local_248 = -(long)*(int *)(lVar12 + 0x20);
          lVar12 = ((*(int *)(lVar12 + 0x2c) - *(int *)(lVar12 + 0x20)) + 1) * local_228 * local_250
          ;
          do {
            if ((int)local_2c4 <= local_2c0) {
              local_220 = (local_260 + (int)local_2b8) * local_268 + local_258;
              local_218 = ((int)local_2b8 + local_248) * local_250 + local_240;
              local_2b0 = (ulong)local_2c4;
              do {
                if (local_2bc <= local_2d0._0_4_) {
                  lVar15 = (local_220 + (long)(int)local_2b0 * 8) * local_238 + local_230;
                  lVar11 = (local_218 + (long)(int)local_2b0 * 8) * local_228 + local_2a0;
                  iVar16 = local_2bc;
                  do {
                    pdVar7 = (double *)(lVar15 + (long)iVar16 * 8);
                    pdVar8 = (double *)(lVar11 + (long)iVar16 * 8);
                    dVar21 = 0.0;
                    dVar22 = 0.0;
                    lVar9 = 3;
                    do {
                      dVar21 = dVar21 + *pdVar7 * *pdVar7;
                      dVar22 = dVar22 + *pdVar8 * *pdVar8;
                      pdVar7 = (double *)((long)pdVar7 + lVar14);
                      pdVar8 = (double *)((long)pdVar8 + lVar12);
                      lVar9 = lVar9 + -1;
                    } while (lVar9 != 0);
                    if (dVar22 < 0.0) {
                      local_298 = dVar21;
                      dStack_290 = dVar22;
                      dVar22 = sqrt(dVar22);
                      dVar21 = local_298;
                    }
                    else {
                      dVar22 = SQRT(dVar22);
                    }
                    if (dVar21 < 0.0) {
                      local_298 = dVar22;
                      dVar21 = sqrt(dVar21);
                      dVar22 = local_298;
                    }
                    else {
                      dVar21 = SQRT(dVar21);
                    }
                    dVar1 = (pGVar5->super_gpu_tuple_impl<0UL,_double>).
                            super_gpu_tuple_element<0UL,_double>.m_value;
                    dVar18 = ABS(dVar21 - dVar22);
                    if (ABS(dVar21 - dVar22) <= dVar1) {
                      dVar18 = dVar1;
                    }
                    (pGVar5->super_gpu_tuple_impl<0UL,_double>).super_gpu_tuple_element<0UL,_double>
                    .m_value = dVar18;
                    bVar17 = iVar16 != local_2d0._0_4_;
                    iVar16 = iVar16 + 1;
                  } while (bVar17);
                }
                iVar16 = (int)local_2b0;
                local_2b0 = (ulong)(iVar16 + 1);
              } while (iVar16 != local_2c0);
            }
            iVar16 = (int)local_2b8;
            local_2b8 = (ulong)(iVar16 + 1);
          } while (iVar16 != local_2a4);
        }
        if (local_1f0.m_fn_value.super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        gVar19.m_value =
             (double)(*local_1f0.m_fn_value._M_invoker)((_Any_data *)&local_1f0.m_fn_value);
        if (local_2d8.m_value <= gVar19.m_value) {
          local_2d8.m_value = gVar19.m_value;
        }
        amrex::MFIter::operator++((MFIter *)local_1b8);
      } while ((int)local_1b8._32_4_ < (int)local_1b8._40_4_);
    }
    amrex::MFIter::~MFIter((MFIter *)local_1b8);
    RVar20 = steady_tol;
    if (verbose != 0) {
      local_2d0 = steady_tol;
      local_1b8._8_8_ = amrex::OutStream();
      local_1b8._0_4_ = *(int *)(DAT_0071a620 + -0x30);
      this_00 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._4_4_ = *(MPI_Comm *)(DAT_0071a620 + -0x48);
      std::__cxx11::ostringstream::ostringstream(this_00);
      *(undefined8 *)(local_1b8 + *(long *)(local_1b8._16_8_ + -0x18) + 0x18) =
           *(undefined8 *)
            ((*(_func_int ***)local_1b8._8_8_)[-3] +
            (long)&((BoxArray *)(local_1b8._8_8_ + 8))->m_bat);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"steadyState :: \n",0x10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"LEV = ",6);
      std::ostream::operator<<(this_00,(local_280->super_AmrLevel).level);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," MAX_CHANGE = ",0xe);
      std::ostream::_M_insert<double>(local_2d8.m_value);
      cVar3 = (char)this_00;
      std::ios::widen((char)*(undefined8 *)(local_1b8._16_8_ + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      amrex::Print::~Print((Print *)local_1b8);
      RVar20 = local_2d0;
      if (local_2d8.m_value < local_2d0) {
        local_1b8._8_8_ = amrex::OutStream();
        local_1b8._0_4_ = *(int *)(DAT_0071a620 + -0x30);
        local_1b8._4_4_ = *(MPI_Comm *)(DAT_0071a620 + -0x48);
        std::__cxx11::ostringstream::ostringstream(this_00);
        *(undefined8 *)(local_1b8 + *(long *)(local_1b8._16_8_ + -0x18) + 0x18) =
             *(undefined8 *)
              ((*(_func_int ***)local_1b8._8_8_)[-3] +
              (long)&((BoxArray *)(local_1b8._8_8_ + 8))->m_bat);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"System reached steady-state, stopping simulation.",0x31);
        std::ios::widen((char)*(undefined8 *)(local_1b8._16_8_ + -0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        amrex::Print::~Print((Print *)local_1b8);
        RVar20 = local_2d0;
      }
    }
    bVar17 = local_2d8.m_value < RVar20;
    if (local_1f0.m_fn_value.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_1f0.m_fn_value.super__Function_base._M_manager)
                ((_Any_data *)&local_1f0.m_fn_value,(_Any_data *)&local_1f0.m_fn_value,
                 __destroy_functor);
    }
    if (local_1f0.m_tuple.
        super_vector<amrex::GpuTuple<double>,_std::allocator<amrex::GpuTuple<double>_>_>.
        super__Vector_base<amrex::GpuTuple<double>,_std::allocator<amrex::GpuTuple<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f0.m_tuple.
                      super_vector<amrex::GpuTuple<double>,_std::allocator<amrex::GpuTuple<double>_>_>
                      .
                      super__Vector_base<amrex::GpuTuple<double>,_std::allocator<amrex::GpuTuple<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f0.m_tuple.
                            super_vector<amrex::GpuTuple<double>,_std::allocator<amrex::GpuTuple<double>_>_>
                            .
                            super__Vector_base<amrex::GpuTuple<double>,_std::allocator<amrex::GpuTuple<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f0.m_tuple.
                            super_vector<amrex::GpuTuple<double>,_std::allocator<amrex::GpuTuple<double>_>_>
                            .
                            super__Vector_base<amrex::GpuTuple<double>,_std::allocator<amrex::GpuTuple<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    uVar10 = (uint)bVar17;
  }
  return uVar10;
}

Assistant:

int
NavierStokesBase::steadyState()
{
    if (!get_state_data(State_Type).hasOldData()) {
        return false; // If nothing to compare to, must not yet be steady :)
    }

    MultiFab&   u_old = get_old_data(State_Type);
    MultiFab&   u_new = get_new_data(State_Type);

	//
	// Estimate the maximum change in velocity magnitude since previous
	// iteration
	//
    Real max_change = 0.0;

    ReduceOps<ReduceOpMax> reduce_op;
    ReduceData<Real> reduce_data(reduce_op);
    using ReduceTuple = typename decltype(reduce_data)::Type;

    // Do not OpenMP-fy this loop for now
    // Unclear how to keep OpenMP and GPU implementation
    // from messing with each other
    for (MFIter mfi(u_old,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const auto& bx   = mfi.tilebox();
        const auto& uold = u_old[mfi].array();
        const auto& unew = u_new[mfi].array();

        reduce_op.eval(bx, reduce_data, [uold, unew]
        AMREX_GPU_DEVICE (int i, int j, int k) -> ReduceTuple
        {
            Real uold_mag = 0.0;
            Real unew_mag = 0.0;
            for (int d = 0; d < AMREX_SPACEDIM; ++d)
            {
                uold_mag += uold(i,j,k,d)*uold(i,j,k,d);
                unew_mag += unew(i,j,k,d)*unew(i,j,k,d);
            }

            uold_mag = std::sqrt(uold_mag);
            unew_mag = std::sqrt(unew_mag);

            return std::abs(unew_mag-uold_mag);
        });

        max_change = std::max(amrex::get<0>(reduce_data.value()),
                              max_change);
    }

    ParallelDescriptor::ReduceRealMax(max_change);

	//
	// System is classified as steady if the maximum change is smaller than
	// prescribed tolerance
	//
    bool steady = max_change < steady_tol;

    if (verbose)
    {
        amrex::Print() << "steadyState :: \n" << "LEV = " << level
                       << " MAX_CHANGE = " << max_change << std::endl;

        if (steady)
        {
            amrex::Print()
                << "System reached steady-state, stopping simulation."
                << std::endl;
        }
    }

    return steady;
}